

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O0

void sycc422_to_rgb(opj_image_t *img)

{
  OPJ_UINT32 OVar1;
  byte bVar2;
  int offset_00;
  int upb_00;
  ulong uVar3;
  long lVar4;
  OPJ_INT32 *__ptr;
  OPJ_INT32 *__ptr_00;
  OPJ_INT32 *__ptr_01;
  ulong uVar5;
  ulong uVar6;
  ulong local_98;
  size_t j;
  size_t i;
  int upb;
  int offset;
  size_t loopmaxw;
  size_t offx;
  size_t max;
  size_t maxh;
  size_t maxw;
  int *cr;
  int *cb;
  int *y;
  int *b;
  int *g;
  int *r;
  int *d2;
  int *d1;
  int *d0;
  opj_image_t *img_local;
  
  bVar2 = (byte)img->comps->prec;
  offset_00 = 1 << (bVar2 - 1 & 0x1f);
  upb_00 = (1 << (bVar2 & 0x1f)) + -1;
  uVar6 = (ulong)img->comps->w;
  uVar3 = (ulong)img->comps->h;
  lVar4 = uVar6 * uVar3;
  cb = img->comps->data;
  cr = img->comps[1].data;
  maxw = (size_t)img->comps[2].data;
  __ptr = (OPJ_INT32 *)malloc(lVar4 * 4);
  __ptr_00 = (OPJ_INT32 *)malloc(lVar4 * 4);
  __ptr_01 = (OPJ_INT32 *)malloc(lVar4 * 4);
  if (((__ptr == (OPJ_INT32 *)0x0) || (__ptr_00 == (OPJ_INT32 *)0x0)) ||
     (__ptr_01 == (OPJ_INT32 *)0x0)) {
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
  }
  else {
    uVar5 = (ulong)(img->x0 & 1);
    uVar6 = uVar6 - uVar5;
    y = __ptr_01;
    b = __ptr_00;
    g = __ptr;
    for (j = 0; j < uVar3; j = j + 1) {
      if (uVar5 != 0) {
        sycc_to_rgb(offset_00,upb_00,*cb,0,0,g,b,y);
        cb = cb + 1;
        g = g + 1;
        b = b + 1;
        y = y + 1;
      }
      for (local_98 = 0; local_98 < (uVar6 & 0xfffffffffffffffe); local_98 = local_98 + 2) {
        sycc_to_rgb(offset_00,upb_00,*cb,*cr,*(int *)maxw,g,b,y);
        sycc_to_rgb(offset_00,upb_00,cb[1],*cr,*(int *)maxw,g + 1,b + 1,y + 1);
        cb = cb + 2;
        g = g + 2;
        b = b + 2;
        y = y + 2;
        cr = cr + 1;
        maxw = maxw + 4;
      }
      if (local_98 < uVar6) {
        sycc_to_rgb(offset_00,upb_00,*cb,*cr,*(int *)maxw,g,b,y);
        cb = cb + 1;
        g = g + 1;
        b = b + 1;
        y = y + 1;
        cr = cr + 1;
        maxw = maxw + 4;
      }
    }
    free(img->comps->data);
    img->comps->data = __ptr;
    free(img->comps[1].data);
    img->comps[1].data = __ptr_00;
    free(img->comps[2].data);
    img->comps[2].data = __ptr_01;
    OVar1 = img->comps->w;
    img->comps[2].w = OVar1;
    img->comps[1].w = OVar1;
    OVar1 = img->comps->h;
    img->comps[2].h = OVar1;
    img->comps[1].h = OVar1;
    OVar1 = img->comps->dx;
    img->comps[2].dx = OVar1;
    img->comps[1].dx = OVar1;
    OVar1 = img->comps->dy;
    img->comps[2].dy = OVar1;
    img->comps[1].dy = OVar1;
    img->color_space = OPJ_CLRSPC_SRGB;
  }
  return;
}

Assistant:

static void sycc422_to_rgb(opj_image_t *img)
{	
	int *d0, *d1, *d2, *r, *g, *b;
	const int *y, *cb, *cr;
	size_t maxw, maxh, max, offx, loopmaxw;
	int offset, upb;
	size_t i;

	upb = (int)img->comps[0].prec;
	offset = 1<<(upb - 1); upb = (1<<upb)-1;

	maxw = (size_t)img->comps[0].w; maxh = (size_t)img->comps[0].h;
	max = maxw * maxh;

	y = img->comps[0].data;
	cb = img->comps[1].data;
	cr = img->comps[2].data;

	d0 = r = (int*)malloc(sizeof(int) * max);
	d1 = g = (int*)malloc(sizeof(int) * max);
	d2 = b = (int*)malloc(sizeof(int) * max);

	if(r == NULL || g == NULL || b == NULL) goto fails;

	/* if img->x0 is odd, then first column shall use Cb/Cr = 0 */
	offx = img->x0 & 1U;
	loopmaxw = maxw - offx;
	
	for(i=0U; i < maxh; ++i)
	{
		size_t j;
		
		if (offx > 0U) {
			sycc_to_rgb(offset, upb, *y, 0, 0, r, g, b);
			++y; ++r; ++g; ++b;
		}
		
		for(j=0U; j < (loopmaxw & ~(size_t)1U); j += 2U)
		{
			sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
			++y; ++r; ++g; ++b;
			sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
			++y; ++r; ++g; ++b; ++cb; ++cr;
		}
		if (j < loopmaxw) {
			sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
			++y; ++r; ++g; ++b; ++cb; ++cr;
		}
	}
	
	free(img->comps[0].data); img->comps[0].data = d0;
	free(img->comps[1].data); img->comps[1].data = d1;
	free(img->comps[2].data); img->comps[2].data = d2;

	img->comps[1].w = img->comps[2].w = img->comps[0].w;
	img->comps[1].h = img->comps[2].h = img->comps[0].h;
	img->comps[1].dx = img->comps[2].dx = img->comps[0].dx;
	img->comps[1].dy = img->comps[2].dy = img->comps[0].dy;
	img->color_space = OPJ_CLRSPC_SRGB;
	return;

fails:
	free(r);
	free(g);
	free(b);
}